

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

void init_dungeons(void)

{
  dungeon *__dest;
  short sVar1;
  uint uVar2;
  char *__s1;
  d_level *pdVar3;
  undefined8 uVar4;
  boolean bVar5;
  xchar xVar6;
  char cVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int x;
  int iVar11;
  int iVar12;
  dlb *dp;
  size_t sVar13;
  branch *new_branch;
  int *piVar14;
  s_level *psVar15;
  s_level *psVar16;
  s_level *psVar17;
  s_level *psVar18;
  s_level *psVar19;
  s_level *psVar20;
  int iVar21;
  dlb *in_RCX;
  dlb *pdVar22;
  ulong uVar23;
  dlb *pdVar24;
  uint uVar25;
  ulong uVar26;
  tmplevel *__src;
  int j;
  int iVar27;
  long lVar28;
  branch **ppbVar29;
  s_level **ppsVar30;
  s_level **ppsVar31;
  tmpbranch *ptr;
  level_map *plVar32;
  tmpbranch *local_1610;
  char tbuf [256];
  version_info vers_info;
  proto_dungeon pd;
  
  pd.n_levs = 0;
  pd.n_brs = 0;
  dp = dlb_fopen("dungeon","r");
  if (dp == (dlb *)0x0) {
    sprintf(tbuf,"Cannot open dungeon description - \"%s","dungeon");
    sVar13 = strlen(tbuf);
    builtin_strncpy(tbuf + sVar13,"\" from ",8);
    sVar13 = strlen(tbuf);
    (tbuf + sVar13)[0] = '\n';
    (tbuf + sVar13)[1] = '\"';
    tbuf[sVar13 + 2] = '\0';
    if (fqn_prefix[1] != (char *)0x0) {
      strcat(tbuf,fqn_prefix[1]);
    }
    sVar13 = strlen(tbuf);
    builtin_strncpy(tbuf + sVar13,"nhdat",6);
    sVar13 = strlen(tbuf);
    builtin_strncpy(tbuf + sVar13,"\" file!",8);
    panic(tbuf);
  }
  iVar12 = (int)dp;
  Fread(&vers_info,0xc,iVar12,in_RCX);
  bVar5 = check_version(&vers_info,"dungeon",'\x01');
  if (bVar5 == '\0') {
    panic("Dungeon description not valid.");
  }
  sp_levchn = (s_level *)0x0;
  Fread(&n_dgns,4,iVar12,in_RCX);
  if (0xf < n_dgns) {
    panic("init_dungeons: too many dungeons");
  }
  memset(dungeons,0,0x380);
  lVar28 = 0;
  pdVar22 = (dlb *)0x0;
  uVar25 = 0;
LAB_00186eaf:
  uVar26 = (ulong)uVar25;
  lVar28 = (long)(int)lVar28;
  __src = pd.tmplevel + lVar28;
  pdVar22 = (dlb *)(long)(int)pdVar22;
  pdVar24 = pdVar22;
  for (; (int)uVar25 < n_dgns; n_dgns = n_dgns + -1) {
    Fread(pd.tmpdungeon + uVar26,0x4c,iVar12,pdVar24);
    if ((flags.debug != '\0') || (iVar27 = pd.tmpdungeon[uVar26].chance, iVar27 == 0))
    goto LAB_00186f7e;
    uVar9 = mt_random();
    pdVar24 = (dlb *)0x64;
    if ((int)(uVar9 % 100) < iVar27) goto LAB_00186f7e;
    for (iVar27 = 0; iVar27 < pd.tmpdungeon[uVar26].levels; iVar27 = iVar27 + 1) {
      Fread(__src,0x30,iVar12,pdVar24);
    }
    for (iVar27 = 0; iVar27 < pd.tmpdungeon[uVar26].branches; iVar27 = iVar27 + 1) {
      Fread(pd.tmpbranch + (long)pdVar22,0x28,iVar12,pdVar24);
    }
  }
  dlb_fclose(dp);
  for (lVar28 = 0; lVar28 != 5; lVar28 = lVar28 + 1) {
    uVar25 = mt_random();
    tune[lVar28] = (char)((ulong)uVar25 % 7) + 'A';
  }
  tune[5] = '\0';
  for (plVar32 = level_map; __s1 = plVar32->lev_name, *__s1 != '\0'; plVar32 = plVar32 + 1) {
    iVar12 = strncmp(__s1,"rogue",6);
    if (((iVar12 != 0) || (flags.rogue_enabled != '\0')) &&
       (psVar15 = find_level(__s1), psVar15 != (s_level *)0x0)) {
      pdVar3 = plVar32->lev_spec;
      pdVar3->dnum = (psVar15->dlevel).dnum;
      pdVar3->dlevel = (psVar15->dlevel).dlevel;
      if ((*__s1 == 'x') && (__s1[1] == '-')) {
        sprintf(psVar15->proto,"%s%s",urole.filecode);
      }
      else {
        if (pdVar3 == &dungeon_topology.d_knox_level) {
          ppbVar29 = &branches;
          do {
            ppbVar29 = &((branch *)ppbVar29)->next->next;
            if ((branch *)ppbVar29 == (branch *)0x0) goto LAB_001875e8;
          } while (((((branch *)ppbVar29)->end2).dnum != dungeon_topology.d_knox_level.dnum) ||
                  ((((branch *)ppbVar29)->end2).dlevel != dungeon_topology.d_knox_level.dlevel));
LAB_001875dc:
          (((branch *)ppbVar29)->end1).dnum = (xchar)n_dgns;
        }
        else {
          if (pdVar3 != &dungeon_topology.d_advcal_level) goto LAB_001875f0;
          ppbVar29 = &branches;
          while (ppbVar29 = &((branch *)ppbVar29)->next->next, (branch *)ppbVar29 != (branch *)0x0)
          {
            if (((((branch *)ppbVar29)->end2).dnum == dungeon_topology.d_advcal_level.dnum) &&
               ((((branch *)ppbVar29)->end2).dlevel == dungeon_topology.d_advcal_level.dlevel))
            goto LAB_001875dc;
          }
        }
LAB_001875e8:
        insert_branch((branch *)ppbVar29,'\x01');
      }
    }
LAB_001875f0:
  }
  if (flags.rogue_enabled == '\0') {
    ppsVar31 = &sp_levchn;
    psVar15 = (s_level *)(s_level **)0x0;
    do {
      ppsVar30 = &psVar15->next;
      ppsVar31 = &(*ppsVar31)->next;
      if ((s_level *)ppsVar31 == (s_level *)0x0) goto LAB_00187651;
      iVar12 = strncmp(((s_level *)ppsVar31)->proto,"rogue",6);
      psVar15 = (s_level *)ppsVar31;
    } while (iVar12 != 0);
    if (ppsVar30 == (s_level **)0x0) {
      ppsVar30 = &sp_levchn;
    }
    *ppsVar30 = ((s_level *)ppsVar31)->next;
  }
LAB_00187651:
  dungeon_topology.d_quest_dnum = dname_to_dnum("The Quest",'\0');
  dungeon_topology.d_sokoban_dnum = dname_to_dnum("Sokoban",'\0');
  dungeon_topology.d_mines_dnum = dname_to_dnum("The Gnomish Mines",'\0');
  dungeon_topology.d_tower_dnum = dname_to_dnum("Vlad\'s Tower",'\0');
  dungeon_topology.d_mall_dnum = dname_to_dnum("Town",'\0');
  dungeon_topology.d_dragon_dnum = dname_to_dnum("The Dragon Caves",'\x01');
  psVar15 = find_level("dummy");
  if (psVar15 != (s_level *)0x0) {
    cVar7 = (psVar15->dlevel).dnum;
    if (1 - dungeons[cVar7].depth_start < (int)dungeons[cVar7].num_dunlevs) {
      dungeons[cVar7].depth_start = dungeons[cVar7].depth_start + -1;
    }
  }
  psVar15 = find_level("dummy");
  psVar16 = find_level("earth");
  psVar17 = find_level("air");
  psVar18 = find_level("fire");
  psVar19 = find_level("water");
  psVar20 = find_level("astral");
  tbuf._0_8_ = psVar19;
  tbuf._8_8_ = psVar18;
  tbuf._16_8_ = psVar17;
  tbuf._24_8_ = psVar16;
  lVar28 = 3;
  while (lVar28 != 0) {
    uVar25 = rn2((int)lVar28 + 1);
    uVar4 = *(undefined8 *)(tbuf + (ulong)uVar25 * 8);
    *(undefined8 *)(tbuf + (ulong)uVar25 * 8) = *(undefined8 *)(tbuf + lVar28 * 8);
    *(undefined8 *)(tbuf + lVar28 * 8) = uVar4;
    lVar28 = lVar28 + -1;
  }
  psVar20->next = (s_level *)tbuf._24_8_;
  for (lVar28 = 0x18; lVar28 != 0; lVar28 = lVar28 + -8) {
    **(undefined8 **)(tbuf + lVar28) = *(undefined8 *)(tbuf + lVar28 + -8);
  }
  *(s_level **)tbuf._0_8_ = psVar15;
  return;
LAB_00186f7e:
  __dest = dungeons + uVar26;
  strcpy(__dest->dname,pd.tmpdungeon[uVar26].name);
  strcpy(dungeons[uVar26].proto,pd.tmpdungeon[uVar26].protoname);
  dungeons[uVar26].boneid = pd.tmpdungeon[uVar26].boneschar;
  sVar1 = pd.tmpdungeon[uVar26].lev.rand;
  if (sVar1 == 0) {
    uVar9 = (uint)(byte)pd.tmpdungeon[uVar26].lev.base;
  }
  else {
    iVar27 = rn2((int)sVar1);
    uVar9 = iVar27 + (int)pd.tmpdungeon[uVar26].lev;
  }
  xVar6 = (xchar)uVar9;
  dungeons[uVar26].num_dunlevs = xVar6;
  if (uVar26 == 0) {
    dungeons[0].depth_start = 1;
    iVar27 = 0;
  }
  else {
    iVar27 = (int)dungeons[(int)(uVar25 - 1)].num_dunlevs + dungeons[(int)(uVar25 - 1)].ledger_start
    ;
  }
  dungeons[uVar26].ledger_start = iVar27;
  *(bool *)(uVar26 * 0x38 + 0x316e2e) = uVar26 == 0;
  *(byte *)&dungeons[uVar26].flags =
       (byte)pd.tmpdungeon[uVar26].flags & 0x7e | *(byte *)&dungeons[uVar26].flags & 0x81;
  uVar2 = pd.tmpdungeon[uVar26].entry_lev;
  pdVar24 = (dlb *)(ulong)uVar2;
  if ((int)uVar2 < 0) {
    bVar8 = (char)uVar2 + xVar6;
    cVar7 = bVar8 + 1;
    pdVar24 = (dlb *)0x1;
    if (0x7e < bVar8) {
      cVar7 = '\x01';
    }
  }
  else {
    if (uVar2 == 0) {
      dungeons[uVar26].entry_lev = '\x01';
      cVar7 = '\x01';
      goto LAB_0018706b;
    }
    uVar9 = uVar9 & 0xff;
    if ((char)uVar2 <= xVar6) {
      uVar9 = uVar2;
    }
    cVar7 = (char)uVar9;
  }
  dungeons[uVar26].entry_lev = cVar7;
LAB_0018706b:
  if (uVar26 != 0) {
    iVar10 = find_branch(__dest->dname,&pd);
    new_branch = (branch *)calloc(1,0x18);
    iVar27 = branch_id + 1;
    new_branch->id = branch_id;
    branch_id = iVar27;
    iVar27 = pd.tmpbranch[iVar10].type;
    switch(iVar27) {
    case 0:
    case 3:
      break;
    case 1:
      iVar27 = (pd.tmpbranch[iVar10].up == 0) + 1;
      break;
    case 2:
      iVar27 = 2 - (uint)(pd.tmpbranch[iVar10].up == 0);
      break;
    default:
      iVar27 = 0;
      impossible("correct_branch_type: unknown branch type");
    }
    new_branch->type = iVar27;
    xVar6 = parent_dnum(__dest->dname,&pd);
    (new_branch->end1).dnum = xVar6;
    xVar6 = parent_dnum(__dest->dname,&pd);
    iVar27 = find_branch(__dest->dname,&pd);
    x = level_range(xVar6,(int)pd.tmpbranch[iVar27].lev.base,(int)pd.tmpbranch[iVar27].lev.rand,
                    pd.tmpbranch[iVar27].chain,&pd,(int *)tbuf);
    iVar11 = rn2(x);
    iVar27 = iVar11;
    do {
      iVar27 = iVar27 + 1;
      if (x <= iVar27) {
        iVar27 = 0;
      }
      iVar21 = iVar27 + tbuf._0_4_;
      ppbVar29 = &branches;
      do {
        ppbVar29 = &((branch *)ppbVar29)->next->next;
        if ((branch *)ppbVar29 == (branch *)0x0) goto LAB_001871e9;
      } while ((((((branch *)ppbVar29)->end1).dnum != xVar6) ||
               (iVar21 != (((branch *)ppbVar29)->end1).dlevel)) &&
              (((((branch *)ppbVar29)->end2).dnum != xVar6 ||
               (iVar21 != (((branch *)ppbVar29)->end2).dlevel))));
    } while (iVar27 != iVar11);
    iVar21 = tbuf._0_4_ + iVar11;
LAB_001871e9:
    (new_branch->end1).dlevel = (xchar)iVar21;
    (new_branch->end2).dnum = (xchar)uVar25;
    iVar27 = pd.tmpbranch[iVar10].up;
    (new_branch->end2).dlevel = cVar7;
    new_branch->end1_up = iVar27 != 0;
    insert_branch(new_branch,'\0');
    uVar9 = (uint)(new_branch->end1).dnum;
    if (uVar25 == uVar9) {
      cVar7 = (char)dungeons[(new_branch->end2).dnum].depth_start + (new_branch->end2).dlevel;
      bVar5 = new_branch->end1_up == '\0';
    }
    else {
      cVar7 = (char)dungeons[(int)uVar9].depth_start + (new_branch->end1).dlevel;
      bVar5 = new_branch->end1_up;
    }
    uVar9 = -(uint)(bVar5 != '\0') | 1;
    if (new_branch->type == 3) {
      uVar9 = 0;
    }
    uVar9 = ((uVar9 + (int)(char)(cVar7 + -1)) - (int)dungeons[uVar26].entry_lev) + 1;
    pdVar24 = (dlb *)(ulong)uVar9;
    dungeons[uVar26].depth_start = uVar9;
    xVar6 = dungeons[uVar26].num_dunlevs;
  }
  if (' ' < xVar6) {
    dungeons[uVar26].num_dunlevs = ' ';
  }
  pd.start = pd.n_levs;
  pd.n_levs = pd.n_levs + pd.tmpdungeon[uVar26].levels;
  if (0x32 < pd.n_levs) {
    panic("init_dungeon: too many special levels");
  }
  piVar14 = &pd.tmpdungeon[uVar26].flags;
  local_1610 = pd.tmpbranch + (long)pdVar22;
  for (; ptr = local_1610, lVar28 < pd.n_levs; lVar28 = lVar28 + 1) {
    Fread(__src,0x30,iVar12,pdVar24);
    pd.final_lev[lVar28] = (s_level *)0x0;
    if (flags.debug == '\0') {
      iVar27 = __src->chance;
      uVar9 = mt_random();
      pdVar24 = (dlb *)0x64;
      if ((int)(uVar9 % 100) < iVar27) goto LAB_0018732f;
    }
    else {
LAB_0018732f:
      psVar15 = (s_level *)calloc(1,0x20);
      pd.final_lev[lVar28] = psVar15;
      strcpy(psVar15->proto,__src->name);
      psVar15->boneid = __src->boneschar;
      (psVar15->dlevel).dnum = (xchar)uVar25;
      uVar9 = __src->flags;
      pdVar24 = (dlb *)(ulong)uVar9;
      bVar8 = (byte)uVar9 & 0xf | *(byte *)&psVar15->flags & 0x80;
      *(byte *)&psVar15->flags = (byte)uVar9 & 0x70 | bVar8;
      if ((uVar9 & 0x70) == 0) {
        uVar23 = CONCAT71((int7)((ulong)piVar14 >> 8),(char)*piVar14) & 0xffffffffffffff70;
        bVar8 = (byte)uVar23 | bVar8;
        pdVar24 = (dlb *)CONCAT71((int7)(uVar23 >> 8),bVar8);
        *(byte *)&psVar15->flags = bVar8;
      }
      psVar15->rndlevs = (uchar)__src->rndlevs;
      psVar15->next = (s_level *)0x0;
    }
    __src = __src + 1;
  }
  bVar5 = place_level(pd.start,&pd);
  if (bVar5 == '\0') {
    panic("init_dungeon:  couldn\'t place levels");
  }
  pdVar24 = (dlb *)(long)pd.start;
  while ((long)pdVar24 < (long)pd.n_levs) {
    psVar15 = pd.final_lev[(long)pdVar24];
    if (psVar15 != (s_level *)0x0) {
      ppsVar31 = &sp_levchn;
      psVar16 = (s_level *)0x0;
      do {
        ppsVar30 = &psVar16->next;
        ppsVar31 = &((s_level *)ppsVar31)->next->next;
        if ((s_level *)ppsVar31 == (s_level *)0x0) break;
        psVar16 = (s_level *)ppsVar31;
      } while (((((s_level *)ppsVar31)->dlevel).dnum != (psVar15->dlevel).dnum) ||
              ((((s_level *)ppsVar31)->dlevel).dlevel <= (psVar15->dlevel).dlevel));
      if ((s_level *)ppsVar30 == (s_level *)0x0) {
        ppsVar30 = &sp_levchn;
        ppsVar31 = &sp_levchn->next;
      }
      psVar15->next = (s_level *)ppsVar31;
      ((s_level *)ppsVar30)->next = psVar15;
    }
    pdVar24 = (dlb *)((long)&pdVar24->fp + 1);
    pd.start = (int)pdVar24;
  }
  pd.n_brs = pd.n_brs + pd.tmpdungeon[uVar26].branches;
  if (0x20 < pd.n_brs) {
    panic("init_dungeon: too many branches");
  }
  for (; (long)pdVar22 < (long)pd.n_brs; pdVar22 = (dlb *)((long)&pdVar22->fp + 1)) {
    Fread(ptr,0x28,iVar12,pdVar24);
    ptr = ptr + 1;
  }
  uVar25 = uVar25 + 1;
  goto LAB_00186eaf;
}

Assistant:

void init_dungeons(void)	/* initialize the "dungeon" structs */
{
	dlb	*dgn_file;
	int i, cl = 0, cb = 0;
	s_level *x;
	struct proto_dungeon pd;
	const struct level_map *lev_map;
	struct version_info vers_info;

	pd.n_levs = pd.n_brs = 0;

	dgn_file = dlb_fopen(DUNGEON_FILE, RDBMODE);
	if (!dgn_file) {
	    char tbuf[BUFSZ];
	    sprintf(tbuf, "Cannot open dungeon description - \"%s",
		DUNGEON_FILE);
	    strcat(tbuf, "\" from ");
	    strcat(tbuf, "\n\"");
	    if (fqn_prefix[DATAPREFIX]) strcat(tbuf, fqn_prefix[DATAPREFIX]);
	    strcat(tbuf, DLBFILE);
	    strcat(tbuf, "\" file!");
	    panic(tbuf);
	}

	/* validate the data's version against the program's version */
	Fread(&vers_info, sizeof vers_info, 1, dgn_file);
	
	if (!check_version(&vers_info, DUNGEON_FILE, TRUE))
	    panic("Dungeon description not valid.");

	/*
	 * Read in each dungeon and transfer the results to the internal
	 * dungeon arrays.
	 */
	sp_levchn = NULL;
	Fread(&n_dgns, sizeof(int), 1, dgn_file);
	if (n_dgns >= MAXDUNGEON)
	    panic("init_dungeons: too many dungeons");

	/*
	 * Zero-out dungeons to prevent replay desyncs, specifically the data
	 * beyond the ends of each dungeon's name/protoname fields.
	 */
	memset(dungeons, 0, MAXDUNGEON * sizeof(dungeon));

	for (i = 0; i < n_dgns; i++) {
	    Fread(&pd.tmpdungeon[i], sizeof(struct tmpdungeon), 1, dgn_file);
	    if (!wizard)
	      if (pd.tmpdungeon[i].chance && (pd.tmpdungeon[i].chance <= rn2(100))) {
		int j;

		/* skip over any levels or branches */
		for (j = 0; j < pd.tmpdungeon[i].levels; j++)
		    Fread(&pd.tmplevel[cl], sizeof(struct tmplevel), 1, dgn_file);

		for (j = 0; j < pd.tmpdungeon[i].branches; j++)
		    Fread(&pd.tmpbranch[cb],
					sizeof(struct tmpbranch), 1, dgn_file);
		n_dgns--; i--;
		continue;
	      }

	    strcpy(dungeons[i].dname, pd.tmpdungeon[i].name);
	    strcpy(dungeons[i].proto, pd.tmpdungeon[i].protoname);
	    dungeons[i].boneid = pd.tmpdungeon[i].boneschar;

	    if (pd.tmpdungeon[i].lev.rand)
		dungeons[i].num_dunlevs = (xchar)rn1(pd.tmpdungeon[i].lev.rand,
						     pd.tmpdungeon[i].lev.base);
	    else dungeons[i].num_dunlevs = (xchar)pd.tmpdungeon[i].lev.base;

	    if (!i) {
		dungeons[i].ledger_start = 0;
		dungeons[i].depth_start = 1;
		dungeons[i].dunlev_ureached = 1;
	    } else {
		dungeons[i].ledger_start = dungeons[i-1].ledger_start +
					      dungeons[i-1].num_dunlevs;
		dungeons[i].dunlev_ureached = 0;
	    }

	    dungeons[i].flags.hellish = !!(pd.tmpdungeon[i].flags & HELLISH);
	    dungeons[i].flags.maze_like = !!(pd.tmpdungeon[i].flags & MAZELIKE);
	    dungeons[i].flags.rogue_like = !!(pd.tmpdungeon[i].flags & ROGUELIKE);
	    dungeons[i].flags.align = ((pd.tmpdungeon[i].flags & D_ALIGN_MASK) >> 4);
	    /*
	     * Set the entry level for this dungeon.  The pd.tmpdungeon entry
	     * value means:
	     *		< 0	from bottom (-1 == bottom level)
	     *		  0	default (top)
	     *		> 0	actual level (1 = top)
	     *
	     * Note that the entry_lev field in the dungeon structure is
	     * redundant.  It is used only here and in print_dungeon().
	     */
	    if (pd.tmpdungeon[i].entry_lev < 0) {
		dungeons[i].entry_lev = dungeons[i].num_dunlevs +
						pd.tmpdungeon[i].entry_lev + 1;
		if (dungeons[i].entry_lev <= 0) dungeons[i].entry_lev = 1;
	    } else if (pd.tmpdungeon[i].entry_lev > 0) {
		dungeons[i].entry_lev = pd.tmpdungeon[i].entry_lev;
		if (dungeons[i].entry_lev > dungeons[i].num_dunlevs)
		    dungeons[i].entry_lev = dungeons[i].num_dunlevs;
	    } else { /* default */
		dungeons[i].entry_lev = 1;	/* defaults to top level */
	    }

	    if (i) {	/* set depth */
		branch *br;
		schar from_depth;
		boolean from_up;

		br = add_branch(i, dungeons[i].entry_lev, &pd);

		/* Get the depth of the connecting end. */
		if (br->end1.dnum == i) {
		    from_depth = depth(&br->end2);
		    from_up = !br->end1_up;
		} else {
		    from_depth = depth(&br->end1);
		    from_up = br->end1_up;
		}

		/*
		 * Calculate the depth of the top of the dungeon via
		 * its branch.  First, the depth of the entry point:
		 *
		 *	depth of branch from "parent" dungeon
		 *	+ -1 or 1 depending on a up or down stair or
		 *	  0 if portal
		 *
		 * Followed by the depth of the top of the dungeon:
		 *
		 *	- (entry depth - 1)
		 *
		 * We'll say that portals stay on the same depth.
		 */
		dungeons[i].depth_start = from_depth
					+ (br->type == BR_PORTAL ? 0 :
							(from_up ? -1 : 1))
					- (dungeons[i].entry_lev - 1);
	    }

	    /* this is redundant - it should have been flagged by dgn_comp */
	    if (dungeons[i].num_dunlevs > MAXLEVEL)
		dungeons[i].num_dunlevs = MAXLEVEL;

	    pd.start = pd.n_levs;	/* save starting point */
	    pd.n_levs += pd.tmpdungeon[i].levels;
	    if (pd.n_levs > LEV_LIMIT)
		panic("init_dungeon: too many special levels");
	    
	    /*
	     * Read in the prototype special levels.  Don't add generated
	     * special levels until they are all placed.
	     */
	    for (; cl < pd.n_levs; cl++) {
		Fread(&pd.tmplevel[cl], sizeof(struct tmplevel), 1, dgn_file);
		init_level(i, cl, &pd);
	    }
	    
	    /*
	     * Recursively place the generated levels for this dungeon.  This
	     * routine will attempt all possible combinations before giving
	     * up.
	     */
	    if (!place_level(pd.start, &pd))
		panic("init_dungeon:  couldn't place levels");

	    for (; pd.start < pd.n_levs; pd.start++)
		if (pd.final_lev[pd.start]) add_level(pd.final_lev[pd.start]);


	    pd.n_brs += pd.tmpdungeon[i].branches;
	    if (pd.n_brs > BRANCH_LIMIT)
		panic("init_dungeon: too many branches");
	    for (; cb < pd.n_brs; cb++)
		Fread(&pd.tmpbranch[cb],
					sizeof(struct tmpbranch), 1, dgn_file);
	}
	dlb_fclose(dgn_file);

	for (i = 0; i < 5; i++) tune[i] = 'A' + rn2(7);
	tune[5] = 0;

	/*
	 * Find most of the special levels and dungeons so we can access their
	 * locations quickly.
	 */
	for (lev_map = level_map; lev_map->lev_name[0]; lev_map++) {
		/* 
		 * suppress finding the rogue level if it is not enabled
		 * this makes Is_rogue_level(x) fail
		 */
		if (!strncmp(lev_map->lev_name, "rogue", 6) &&
		    !flags.rogue_enabled)
		    continue;
		
		x = find_level(lev_map->lev_name);
		if (x) {
			assign_level(lev_map->lev_spec, &x->dlevel);
			if (!strncmp(lev_map->lev_name, "x-", 2)) {
				/* This is where the name substitution on the
				 * levels of the quest dungeon occur.
				 */
				sprintf(x->proto, "%s%s", urole.filecode, &lev_map->lev_name[1]);
			} else if (lev_map->lev_spec == &knox_level) {
				branch *br;
				/*
				 * Kludge to allow floating Knox entrance.  We
				 * specify a floating entrance by the fact that
				 * its entrance (end1) has a bogus dnum, namely
				 * n_dgns.
				 */
				for (br = branches; br; br = br->next)
				    if (on_level(&br->end2, &knox_level)) break;

				if (br) br->end1.dnum = n_dgns;
				/* adjust the branch's position on the list */
				insert_branch(br, TRUE);
			} else if (lev_map->lev_spec == &advcal_level) {
				branch *br;
				/*
				 * Kludge to allow floating advcal entrance.  We
				 * specify a floating entrance by the fact that
				 * its entrance (end1) has a bogus dnum, namely
				 * n_dgns.
				 */
				for (br = branches; br; br = br->next)
				    if (on_level(&br->end2, &advcal_level)) break;

				if (br) br->end1.dnum = n_dgns;
				/* adjust the branch's position on the list */
				insert_branch(br, TRUE);
			}
		}
	}
	
	if (!flags.rogue_enabled) {
	    /* 
	     * remove rogue level from the special level chain
	     * This makes Is_special(x) return NULL, so the level will never be
	     * instantiated
	     */
	    s_level *s_curr, *s_prev;
	    s_prev = NULL;
	    for (s_curr = sp_levchn; s_curr; s_curr = s_curr->next) {
		if (!strncmp(s_curr->proto, "rogue", 6)) {
		    if (s_prev)
			s_prev->next = s_curr->next;
		    else
			sp_levchn = s_curr->next;
		    
		    break;
		}
		s_prev = s_curr;
	    }
	}

/*
 *	I hate hardwiring these names. :-(
 */
	quest_dnum = dname_to_dnum("The Quest", FALSE);
	sokoban_dnum = dname_to_dnum("Sokoban", FALSE);
	mines_dnum = dname_to_dnum("The Gnomish Mines", FALSE);
	tower_dnum = dname_to_dnum("Vlad's Tower", FALSE);
	mall_dnum = dname_to_dnum("Town", FALSE);
	dragon_dnum = dname_to_dnum("The Dragon Caves", TRUE);

	/* one special fixup for dummy surface level */
	if ((x = find_level("dummy")) != 0) {
	    i = x->dlevel.dnum;
	    /* the code above puts earth one level above dungeon level #1,
	       making the dummy level overlay level 1; but the whole reason
	       for having the dummy level is to make earth have depth -1
	       instead of 0, so adjust the start point to shift endgame up */
	    if (dunlevs_in_dungeon(&x->dlevel) > 1 - dungeons[i].depth_start)
		dungeons[i].depth_start -= 1;
	    /* TO DO: strip "dummy" out all the way here,
	       so that it's hidden from <ctrl/O> feedback. */
	}

	shuffle_planes();
}